

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

int launchTests(testDescPtr tst,uint test)

{
  bool bVar1;
  int iVar2;
  int local_3c;
  size_t sStack_38;
  int fail;
  size_t limit;
  uint local_28;
  uint j;
  uint i;
  int err;
  int res;
  uint test_local;
  testDescPtr tst_local;
  
  j = 0;
  if (tst == (testDescPtr)0x0) {
    tst_local._4_4_ = 0xffffffff;
  }
  else {
    for (local_28 = 0; local_28 < 0xc; local_28 = local_28 + 1) {
      sStack_38 = limitDescriptions[local_28].limit;
      local_3c = limitDescriptions[local_28].fail;
      bVar1 = false;
      while (!bVar1) {
        if ((testExceptions[0].test == test) && (testExceptions[0].limit == local_28)) {
          if (testExceptions[0].fail != -1) {
            local_3c = testExceptions[0].fail;
          }
          if (testExceptions[0].size != 0) {
            sStack_38 = testExceptions[0].size;
          }
          break;
        }
        bVar1 = true;
      }
      iVar2 = (*tst->func)(limitDescriptions[local_28].name,sStack_38,
                           limitDescriptions[local_28].options,local_3c);
      if (iVar2 != 0) {
        nb_errors = nb_errors + 1;
        j = j + 1;
      }
    }
    tst_local._4_4_ = j;
  }
  return tst_local._4_4_;
}

Assistant:

static int
launchTests(testDescPtr tst, unsigned int test) {
    int res = 0, err = 0;
    unsigned int i, j;
    size_t limit;
    int fail;

    if (tst == NULL) return(-1);

    for (i = 0;i < sizeof(limitDescriptions)/sizeof(limitDescriptions[0]);i++) {
        limit = limitDescriptions[i].limit;
        fail = limitDescriptions[i].fail;
        /*
         * Handle exceptions if any
         */
        for (j = 0;j < sizeof(testExceptions)/sizeof(testExceptions[0]);j++) {
            if ((testExceptions[j].test == test) &&
                (testExceptions[j].limit == i)) {
                if (testExceptions[j].fail != -1)
                    fail = testExceptions[j].fail;
                if (testExceptions[j].size != 0)
                    limit = testExceptions[j].size;
                break;
            }
        }
        res = tst->func(limitDescriptions[i].name, limit,
                        limitDescriptions[i].options, fail);
        if (res != 0) {
            nb_errors++;
            err++;
        }
    }
    return(err);
}